

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

int __thiscall MovDemuxer::mov_read_tfhd(MovDemuxer *this,MOVAtom atom)

{
  uint uVar1;
  uint uVar2;
  int64_t iVar3;
  undefined4 *puVar4;
  int iVar5;
  MOVTrackExt *i;
  pointer pMVar6;
  ostringstream ss;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ostringstream local_198 [376];
  
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  uVar1 = IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  iVar5 = -1;
  if ((0 < (int)uVar2) && ((int)uVar2 <= (this->super_IOContextDemuxer).num_tracks)) {
    (this->fragment).track_id = uVar2;
    pMVar6 = (this->trex_data).
             super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>.
             _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pMVar6 == (this->trex_data).
                    super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"could not find corresponding trex",0x21);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 3;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1b8 == &local_1a8) {
          puVar4[6] = local_1a8;
          puVar4[7] = uStack_1a4;
          puVar4[8] = uStack_1a0;
          puVar4[9] = uStack_19c;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1b8;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1a4,local_1a8);
        }
        *(undefined8 *)(puVar4 + 4) = local_1b0;
        local_1a8 = local_1a8 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      if (pMVar6->track_id == uVar2) break;
      pMVar6 = pMVar6 + 1;
    }
    if ((uVar1 & 1) == 0) {
      iVar3 = (this->fragment).moof_offset;
    }
    else {
      iVar3 = IOContextDemuxer::get_be64(&this->super_IOContextDemuxer);
    }
    (this->fragment).base_data_offset = iVar3;
    if ((uVar1 & 2) == 0) {
      uVar2 = pMVar6->stsd_id;
    }
    else {
      uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).stsd_id = uVar2;
    if ((uVar1 & 8) == 0) {
      uVar2 = pMVar6->duration;
    }
    else {
      uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).duration = uVar2;
    if ((uVar1 & 0x10) == 0) {
      uVar2 = pMVar6->size;
    }
    else {
      uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).size = uVar2;
    if ((uVar1 & 0x20) == 0) {
      uVar1 = pMVar6->flags;
    }
    else {
      uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).flags = uVar1;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int MovDemuxer::mov_read_tfhd(MOVAtom atom)
{
    MOVFragment* frag = &fragment;
    const MOVTrackExt* trex = nullptr;

    get_byte();  // version
    const int flags = get_be24();

    const int track_id = static_cast<int>(get_be32());
    if (track_id <= 0 || track_id > num_tracks)
        return -1;
    frag->track_id = track_id;
    for (const auto& i : trex_data)
        if (i.track_id == frag->track_id)
        {
            trex = &i;
            break;
        }
    if (!trex)
        THROW(ERR_COMMON, "could not find corresponding trex")

    if (flags & 0x01)
        frag->base_data_offset = get_be64();
    else
        frag->base_data_offset = frag->moof_offset;
    if (flags & 0x02)
        frag->stsd_id = get_be32();
    else
        frag->stsd_id = trex->stsd_id;

    frag->duration = flags & 0x08 ? get_be32() : trex->duration;
    frag->size = flags & 0x10 ? get_be32() : trex->size;
    frag->flags = flags & 0x20 ? get_be32() : trex->flags;
    return 0;
}